

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O2

void __thiscall bloaty::dwarf::LineInfoReader::Advance(LineInfoReader *this,uint64_t amount)

{
  uint8_t max_per_instr;
  
  max_per_instr = (this->params_).maximum_operations_per_instruction;
  if (max_per_instr == '\x01') {
    (this->info_).address =
         (this->info_).address +
         ((this->info_).op_index + amount) * (ulong)(this->params_).minimum_instruction_length;
    (this->info_).op_index = '\0';
    return;
  }
  DoAdvance(this,amount,max_per_instr);
  return;
}

Assistant:

void LineInfoReader::Advance(uint64_t amount) {
  if (params_.maximum_operations_per_instruction == 1) {
    // This is by far the common case (only false on VLIW architectuers),
    // and this inlining/specialization avoids a costly division.
    DoAdvance(amount, 1);
  } else {
    DoAdvance(amount, params_.maximum_operations_per_instruction);
  }
}